

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O3

ulong __thiscall CVmObjIterIdx::rebuild_image(CVmObjIterIdx *this,char *buf,ulong buflen)

{
  char *pcVar1;
  undefined8 uVar2;
  
  if (0x14 < buflen) {
    pcVar1 = (this->super_CVmObjIter).super_CVmObject.ext_;
    *(undefined8 *)(buf + 0xd) = *(undefined8 *)(pcVar1 + 0xd);
    uVar2 = *(undefined8 *)(pcVar1 + 8);
    *(undefined8 *)buf = *(undefined8 *)pcVar1;
    *(undefined8 *)(buf + 8) = uVar2;
  }
  return 0x15;
}

Assistant:

ulong CVmObjIterIdx::rebuild_image(VMG_ char *buf, ulong buflen)
{
    /* calculate our data size - just store our entire extension */
    size_t copy_size = VMOBJITERIDX_EXT_SIZE;

    /* make sure we have room for our data */
    if (copy_size > buflen)
        return copy_size;

    /* copy the data */
    memcpy(buf, ext_, copy_size);

    /* return the size */
    return copy_size;
}